

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O0

QList<QObject_*> * __thiscall
QObject::findChildren<QObject*>(QObject *this,QAnyStringView aName,FindChildOptions options)

{
  QAnyStringView name;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RCX;
  undefined8 in_RDX;
  QFlagsStorage<Qt::FindChildOption> options_00;
  QList<void_*> *in_RSI;
  QMetaObject *in_RDI;
  long in_FS_OFFSET;
  QList<QObject_*> *list;
  QMetaObject *mo;
  QObject *in_stack_ffffffffffffff98;
  size_t sVar1;
  
  options_00.i = (Int)((ulong)in_RDX >> 0x20);
  sVar1 = *(size_t *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).data = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).superdata.direct = (QMetaObject *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).stringdata = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  mo = in_RDI;
  QList<QObject_*>::QList((QList<QObject_*> *)0x410c4e);
  name.m_size = sVar1;
  name.field_0.m_data = in_RCX.m_data;
  qt_qFindChildren_helper(in_stack_ffffffffffffff98,name,mo,in_RSI,(FindChildOptions)options_00.i);
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar1) {
    __stack_chk_fail();
  }
  return (QList<QObject_*> *)in_RDI;
}

Assistant:

QList<T> findChildren(QAnyStringView aName, Qt::FindChildOptions options = Qt::FindChildrenRecursively) const
    {
        typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type ObjType;
        static_assert(QtPrivate::HasQ_OBJECT_Macro<ObjType>::Value,
                          "No Q_OBJECT in the class passed to QObject::findChildren");
        QList<T> list;
        qt_qFindChildren_helper(this, aName, ObjType::staticMetaObject,
                                reinterpret_cast<QList<void *> *>(&list), options);
        return list;
    }